

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormat::ByteSize(Message *message)

{
  pointer ppFVar1;
  Descriptor *this;
  size_t sVar2;
  UnknownFieldSet *pUVar3;
  Reflection *this_00;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  int i;
  int index;
  long lVar4;
  pointer ppFVar5;
  Metadata MVar6;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_58;
  FieldDescriptor *local_38;
  
  MVar6 = Message::GetMetadata(message);
  this = MVar6.descriptor;
  MVar6 = Message::GetMetadata(message);
  this_00 = MVar6.reflection;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->options_->field_0)._impl_.map_entry_ == true) {
    for (index = 0; index < this->field_count_; index = index + 1) {
      local_38 = Descriptor::field(this,index);
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::emplace_back<google::protobuf::FieldDescriptor_const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)&local_58,&local_38);
    }
  }
  else {
    Reflection::ListFields
              (this_00,message,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&local_58);
  }
  ppFVar1 = local_58._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = 0;
  for (ppFVar5 = local_58._M_impl.super__Vector_impl_data._M_start; ppFVar5 != ppFVar1;
      ppFVar5 = ppFVar5 + 1) {
    sVar2 = FieldByteSize(*ppFVar5,message);
    lVar4 = lVar4 + sVar2;
  }
  if ((this->options_->field_0)._impl_.message_set_wire_format_ == true) {
    pUVar3 = Reflection::GetUnknownFields(this_00,message);
    sVar2 = ComputeUnknownMessageSetItemsSize(pUVar3);
  }
  else {
    pUVar3 = Reflection::GetUnknownFields(this_00,message);
    sVar2 = ComputeUnknownFieldsSize(pUVar3);
  }
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_58);
  return sVar2 + lVar4;
}

Assistant:

size_t WireFormat::ByteSize(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();

  size_t our_size = 0;

  std::vector<const FieldDescriptor*> fields;

  // Fields of map entry should always be serialized.
  if (descriptor->options().map_entry()) {
    for (int i = 0; i < descriptor->field_count(); i++) {
      fields.push_back(descriptor->field(i));
    }
  } else {
    message_reflection->ListFields(message, &fields);
  }

  for (const FieldDescriptor* field : fields) {
    our_size += FieldByteSize(field, message);
  }

  if (descriptor->options().message_set_wire_format()) {
    our_size += ComputeUnknownMessageSetItemsSize(
        message_reflection->GetUnknownFields(message));
  } else {
    our_size +=
        ComputeUnknownFieldsSize(message_reflection->GetUnknownFields(message));
  }

  return our_size;
}